

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSampler_Test::TestBody
          (Sampler_testProbabilisticSampler_Test *this)

{
  ulong uVar1;
  long lVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ProbabilisticSampler *this_01;
  char *pcVar3;
  AssertHelper local_1c0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1a8 [8];
  SamplingStatus result;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined8 local_148;
  undefined1 local_140 [16];
  undefined8 local_130;
  undefined1 local_128;
  undefined8 local_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108 [16];
  byte local_f8;
  AssertionResult gtest_ar_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  undefined8 local_a0;
  undefined1 local_98;
  undefined8 local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  byte local_68;
  ProbabilisticSampler sampler;
  
  ProbabilisticSampler::ProbabilisticSampler(&sampler,0.5);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x800000000000000a;
  std::__cxx11::string::string((string *)&gtest_ar,"op",(allocator *)&gtest_ar_1);
  ProbabilisticSampler::isSampled(&result,&sampler,(TraceID *)&gtest_ar_,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  this_00 = &gtest_ar_.message_;
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,result._isSampled) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (result._isSampled == false) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(this_00);
    gtest_ar_.success_ = true;
    gtest_ar_._1_7_ = 0;
    gtest_ar_1._0_8_ =
         ((long)result._tags.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)result._tags.
               super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
               super__Vector_impl_data._M_start) / 0x48;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar,"sizeof(testProbablisticExpectedTags) / sizeof(Tag)",
               "(result.tags()).size()",(unsigned_long *)&gtest_ar_,(unsigned_long *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x77,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_);
LAB_001cdd6b:
      this_00 = &gtest_ar.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      lVar2 = 0;
      for (uVar1 = 0;
          uVar1 < (ulong)(((long)result._tags.
                                 super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)result._tags.
                                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x48);
          uVar1 = uVar1 + 1) {
        gtest_ar._0_8_ = &sampling_manager::thrift::OperationSamplingStrategy::vtable;
        gtest_ar.message_.ptr_ = &local_168;
        local_168._M_dataplus._M_p._0_1_ = '\0';
        local_168.field_2._M_allocated_capacity._0_4_ = 0;
        local_168.field_2._8_8_ = local_140;
        local_148 = 0;
        local_140[0] = 0;
        local_130 = 0;
        local_128 = 0;
        local_120 = 0;
        local_118 = local_108;
        local_110 = 0;
        local_108[0] = 0;
        local_f8 = local_f8 & 0xe0;
        gtest_ar_._0_8_ = &sampling_manager::thrift::OperationSamplingStrategy::vtable;
        gtest_ar_.message_.ptr_ = &local_d8;
        local_d8._M_dataplus._M_p._0_1_ = '\0';
        local_d8.field_2._M_allocated_capacity._0_4_ = 0;
        local_d8.field_2._8_8_ = local_b0;
        local_b8 = 0;
        local_b0[0] = 0;
        local_a0 = 0;
        local_98 = 0;
        local_90 = 0;
        local_88 = local_78;
        local_80 = 0;
        local_78[0] = 0;
        local_68 = local_68 & 0xe0;
        jaegertracing::Tag::thrift
                  ((Tag *)((anonymous_namespace)::testProbablisticExpectedTags + lVar2));
        jaegertracing::Tag::thrift
                  ((Tag *)((long)&((result._tags.
                                    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus.
                                  _M_p + lVar2));
        testing::internal::CmpHelperEQ<jaegertracing::thrift::Tag,jaegertracing::thrift::Tag>
                  ((internal *)&gtest_ar_1,"thriftTagArr","thriftTagVec",(Tag *)&gtest_ar,
                   (Tag *)&gtest_ar_);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)local_1c0);
          if (gtest_ar_1.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (local_1a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x77,pcVar3);
          testing::internal::AssertHelper::operator=(local_1a8,(Message *)local_1c0);
          goto LAB_001cde67;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_1.message_);
        jaegertracing::thrift::Tag::~Tag((Tag *)&gtest_ar_);
        jaegertracing::thrift::Tag::~Tag((Tag *)&gtest_ar);
        lVar2 = lVar2 + 0x48;
      }
      gtest_ar_1.success_ = false;
      gtest_ar_1._1_7_ = 0;
      gtest_ar_1.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &DAT_7fffffffffffffec;
      std::__cxx11::string::string((string *)&gtest_ar_,"op",(allocator *)local_1c0);
      ProbabilisticSampler::isSampled
                ((SamplingStatus *)&gtest_ar,&sampler,(TraceID *)&gtest_ar_1,(string *)&gtest_ar_);
      SamplingStatus::operator=(&result,(SamplingStatus *)&gtest_ar);
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
                 &gtest_ar.message_);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      gtest_ar_.success_ = result._isSampled;
      this_00 = &gtest_ar_.message_;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (result._isSampled != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(this_00);
        gtest_ar_.success_ = true;
        gtest_ar_._1_7_ = 0;
        gtest_ar_1._0_8_ =
             ((long)result._tags.
                    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)result._tags.
                   super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x48;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"sizeof(testProbablisticExpectedTags) / sizeof(Tag)",
                   "(result.tags()).size()",(unsigned_long *)&gtest_ar_,(unsigned_long *)&gtest_ar_1
                  );
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_1,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x7c,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_);
          goto LAB_001cdd6b;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        lVar2 = 0;
        uVar1 = 0;
LAB_001cdb79:
        if (uVar1 < (ulong)(((long)result._tags.
                                   super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)result._tags.
                                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x48)) {
          gtest_ar._0_8_ = &sampling_manager::thrift::OperationSamplingStrategy::vtable;
          gtest_ar.message_.ptr_ = &local_168;
          local_168._M_dataplus._M_p._0_1_ = '\0';
          local_168.field_2._M_allocated_capacity._0_4_ = 0;
          local_168.field_2._8_8_ = local_140;
          local_148 = 0;
          local_140[0] = 0;
          local_130 = 0;
          local_128 = 0;
          local_120 = 0;
          local_118 = local_108;
          local_110 = 0;
          local_108[0] = 0;
          local_f8 = local_f8 & 0xe0;
          gtest_ar_._0_8_ = &sampling_manager::thrift::OperationSamplingStrategy::vtable;
          gtest_ar_.message_.ptr_ = &local_d8;
          local_d8._M_dataplus._M_p._0_1_ = '\0';
          local_d8.field_2._M_allocated_capacity._0_4_ = 0;
          local_d8.field_2._8_8_ = local_b0;
          local_b8 = 0;
          local_b0[0] = 0;
          local_a0 = 0;
          local_98 = 0;
          local_90 = 0;
          local_88 = local_78;
          local_80 = 0;
          local_78[0] = 0;
          local_68 = local_68 & 0xe0;
          jaegertracing::Tag::thrift
                    ((Tag *)((anonymous_namespace)::testProbablisticExpectedTags + lVar2));
          jaegertracing::Tag::thrift
                    ((Tag *)((long)&((result._tags.
                                      super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_key)._M_dataplus.
                                    _M_p + lVar2));
          testing::internal::CmpHelperEQ<jaegertracing::thrift::Tag,jaegertracing::thrift::Tag>
                    ((internal *)&gtest_ar_1,"thriftTagArr","thriftTagVec",(Tag *)&gtest_ar,
                     (Tag *)&gtest_ar_);
          if (gtest_ar_1.success_ != false) goto code_r0x001cdcf5;
          testing::Message::Message((Message *)local_1c0);
          if (gtest_ar_1.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (local_1a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x7c,pcVar3);
          testing::internal::AssertHelper::operator=(local_1a8,(Message *)local_1c0);
LAB_001cde67:
          testing::internal::AssertHelper::~AssertHelper(local_1a8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_1c0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_1.message_);
          jaegertracing::thrift::Tag::~Tag((Tag *)&gtest_ar_);
          jaegertracing::thrift::Tag::~Tag((Tag *)&gtest_ar);
          goto LAB_001cdd8f;
        }
        std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&result._tags)
        ;
        ProbabilisticSampler::~ProbabilisticSampler(&sampler);
        ProbabilisticSampler::ProbabilisticSampler((ProbabilisticSampler *)&gtest_ar,1.0);
        result._isSampled = false;
        result._1_7_ = 0;
        result._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x8000000000000000;
        std::__cxx11::string::string((string *)&sampler,"op",(allocator *)&gtest_ar_1);
        ProbabilisticSampler::isSampled
                  ((SamplingStatus *)&gtest_ar_,(ProbabilisticSampler *)&gtest_ar,(TraceID *)&result
                   ,(string *)&sampler);
        std::__cxx11::string::~string((string *)&sampler);
        result._isSampled = gtest_ar_.success_;
        result._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)&sampler,&result._isSampled,"result.isSampled()","false");
          testing::internal::AssertHelper::AssertHelper
                    (local_1c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x82,(char *)sampler.super_Sampler._vptr_Sampler);
          testing::internal::AssertHelper::operator=(local_1c0,(Message *)&gtest_ar_1);
LAB_001ce110:
          testing::internal::AssertHelper::~AssertHelper(local_1c0);
          std::__cxx11::string::~string((string *)&sampler);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_1);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&result._tags);
          gtest_ar_1.success_ = false;
          gtest_ar_1._1_7_ = 0;
          gtest_ar_1.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &DAT_7fffffffffffffec;
          std::__cxx11::string::string((string *)&result,"op",(allocator *)local_1c0);
          ProbabilisticSampler::isSampled
                    ((SamplingStatus *)&sampler,(ProbabilisticSampler *)&gtest_ar,
                     (TraceID *)&gtest_ar_1,(string *)&result);
          SamplingStatus::operator=((SamplingStatus *)&gtest_ar_,(SamplingStatus *)&sampler);
          std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                    ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
                     &sampler._samplingRate);
          std::__cxx11::string::~string((string *)&result);
          result._isSampled = gtest_ar_.success_;
          result._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)&sampler,&result._isSampled,"result.isSampled()","false");
            testing::internal::AssertHelper::AssertHelper
                      (local_1c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x86,(char *)sampler.super_Sampler._vptr_Sampler);
            testing::internal::AssertHelper::operator=(local_1c0,(Message *)&gtest_ar_1);
            goto LAB_001ce110;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&result._tags);
        std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                  ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
                   &gtest_ar_.message_);
        this_01 = (ProbabilisticSampler *)&gtest_ar;
        goto LAB_001cdda1;
      }
      testing::Message::Message((Message *)&gtest_ar_1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&gtest_ar,&gtest_ar_.success_,"result.isSampled()","false");
      testing::internal::AssertHelper::AssertHelper
                (local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x7b,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(local_1c0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper(local_1c0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"result.isSampled()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
               ,0x76,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(local_1c0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
LAB_001cdd8f:
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&result._tags);
  this_01 = &sampler;
LAB_001cdda1:
  ProbabilisticSampler::~ProbabilisticSampler(this_01);
  return;
code_r0x001cdcf5:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  jaegertracing::thrift::Tag::~Tag((Tag *)&gtest_ar_);
  jaegertracing::thrift::Tag::~Tag((Tag *)&gtest_ar);
  uVar1 = uVar1 + 1;
  lVar2 = lVar2 + 0x48;
  goto LAB_001cdb79;
}

Assistant:

TEST(Sampler, testProbabilisticSampler)
{
    {
        ProbabilisticSampler sampler(0.5);
        auto result =
            sampler.isSampled(TraceID(0, kTestMaxID + 10), kTestOperationName);
        ASSERT_FALSE(result.isSampled());
        CMP_TAGS(testProbablisticExpectedTags, result.tags());

        result =
            sampler.isSampled(TraceID(0, kTestMaxID - 20), kTestOperationName);
        ASSERT_TRUE(result.isSampled());
        CMP_TAGS(testProbablisticExpectedTags, result.tags());
    }
    {
        ProbabilisticSampler sampler(1.0);
        auto result =
            sampler.isSampled(TraceID(0, kTestMaxID), kTestOperationName);
        ASSERT_TRUE(result.isSampled());

        result =
            sampler.isSampled(TraceID(0, kTestMaxID - 20), kTestOperationName);
        ASSERT_TRUE(result.isSampled());
    }
}